

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteBlif.c
# Opt level: O0

void Cba_ManWriteBlif(char *pFileName,Cba_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  void *pvVar3;
  FILE *__stream;
  char *pcVar4;
  char *pcVar5;
  Cba_Ntk_t *p_00;
  int local_2c;
  int i;
  Cba_Ntk_t *pNtk;
  FILE *pFile;
  Cba_Man_t *p_local;
  char *pFileName_local;
  
  if ((p->pMioLib == (void *)0x0) ||
     (pvVar1 = p->pMioLib, pvVar3 = Abc_FrameReadLibGen(), pvVar1 == pvVar3)) {
    __stream = fopen(pFileName,"wb");
    if (__stream == (FILE *)0x0) {
      printf("Cannot open output file \"%s\".\n",pFileName);
    }
    else {
      pcVar4 = Cba_ManName(p);
      pcVar5 = Extra_TimeStamp();
      fprintf(__stream,"# Design \"%s\" written via CBA package in ABC on %s\n\n",pcVar4,pcVar5);
      for (local_2c = 1; iVar2 = Cba_ManNtkNum(p), local_2c <= iVar2; local_2c = local_2c + 1) {
        p_00 = Cba_ManNtk(p,local_2c);
        Cba_ManWriteBlifNtk((FILE *)__stream,p_00);
      }
      fclose(__stream);
    }
  }
  else {
    printf("Genlib library used in the mapped design is not longer a current library.\n");
  }
  return;
}

Assistant:

void Cba_ManWriteBlif( char * pFileName, Cba_Man_t * p )
{
    FILE * pFile;
    Cba_Ntk_t * pNtk; 
    int i;
    // check the library
    if ( p->pMioLib && p->pMioLib != Abc_FrameReadLibGen() )
    {
        printf( "Genlib library used in the mapped design is not longer a current library.\n" );
        return;
    }
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "# Design \"%s\" written via CBA package in ABC on %s\n\n", Cba_ManName(p), Extra_TimeStamp() );
//    Cba_ManAssignInternWordNames( p );
    Cba_ManForEachNtk( p, pNtk, i )
        Cba_ManWriteBlifNtk( pFile, pNtk );
    fclose( pFile );
}